

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

coda_type * coda_product_class_get_named_type(coda_product_class *product_class,char *name)

{
  long lVar1;
  int index;
  char *name_local;
  coda_product_class *product_class_local;
  
  lVar1 = coda_hashtable_get_index_from_name(product_class->named_type_hash_data,name);
  if ((int)lVar1 == -1) {
    coda_set_error(-400,"product class %s does not contain a named type with name %s",
                   product_class->name,name);
    product_class_local = (coda_product_class *)0x0;
  }
  else {
    product_class_local = (coda_product_class *)product_class->named_type[(int)lVar1];
  }
  return (coda_type *)product_class_local;
}

Assistant:

coda_type *coda_product_class_get_named_type(const coda_product_class *product_class, const char *name)
{
    int index;

    index = hashtable_get_index_from_name(product_class->named_type_hash_data, name);
    if (index == -1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product class %s does not contain a named type with name %s",
                       product_class->name, name);
        return NULL;
    }

    return product_class->named_type[index];
}